

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

void __thiscall
Minisat::OnlineProofChecker::addParsedclause(OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  int iVar1;
  CRef CVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  int i_1;
  long lVar4;
  int i;
  CRef ref;
  undefined8 uStack_28;
  
  iVar1 = cls->sz;
  if (iVar1 == 0) {
    *this = (OnlineProofChecker)0x0;
  }
  else {
    uStack_28 = in_RAX;
    for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
      while (*(int *)(this + 0xe0) <= cls->data[lVar4].x >> 1) {
        newVar(this);
      }
      iVar1 = cls->sz;
    }
    if (iVar1 < 2) {
      vec<Minisat::Lit>::push((vec<Minisat::Lit> *)(this + 0x30),cls->data);
    }
    else {
      CVar2 = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                        ((ClauseAllocator *)(this + 8),cls,false);
      uStack_28 = CONCAT44(CVar2,(undefined4)uStack_28);
      for (lVar4 = 0; lVar4 < cls->sz; lVar4 = lVar4 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)cls->data[lVar4].x * 0x18 + *(long *)(this + 0x40)),
                   (value_type_conflict2 *)((long)&uStack_28 + 4));
      }
      attachClause(this,uStack_28._4_4_);
      vec<unsigned_int>::push((vec<unsigned_int> *)(this + 0x20),(uint *)((long)&uStack_28 + 4));
    }
    if (1 < *(int *)(this + 0xf8)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"c added clause ");
      poVar3 = operator<<(poVar3,cls);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return;
}

Assistant:

inline void OnlineProofChecker::addParsedclause(const vec<Lit> &cls)
{
    if (cls.size() == 0) {
        ok = false;
        return;
    }

    // have enough variables present
    for (int i = 0; i < cls.size(); ++i) {
        while (nVars() <= var(cls[i])) {
            newVar();
        }
    }

    if (cls.size() > 1) {
        CRef ref = ca.alloc(cls, false);
        for (int i = 0; i < cls.size(); ++i) {
            occ[toInt(cls[i])].push_back(ref);
        }
        attachClause(ref);
        clauses.push(ref);
    } else {
        unitClauses.push(cls[0]);
    }

    if (verbose > 1) {
        std::cerr << "c added clause " << cls << std::endl;
    }
    // here, do not check whether the clause is entailed, because its still input!
}